

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

double __thiscall
baryonyx::itm::quadratic_cost_type<double>::operator[](quadratic_cost_type<double> *this,int index)

{
  int iVar1;
  type pdVar2;
  type piVar3;
  type pqVar4;
  int local_24;
  int last;
  int first;
  double ret;
  int index_local;
  quadratic_cost_type<double> *this_local;
  
  pdVar2 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                     (&this->linear_elements,(long)index);
  _last = *pdVar2;
  piVar3 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                     (&this->indices,(long)index);
  local_24 = *piVar3;
  piVar3 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                     (&this->indices,(long)(index + 1));
  iVar1 = *piVar3;
  for (; local_24 != iVar1; local_24 = local_24 + 1) {
    pqVar4 = std::
             unique_ptr<baryonyx::itm::quadratic_cost_type<double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
             ::operator[](&this->quadratic_elements,(long)local_24);
    _last = pqVar4->factor + _last;
  }
  return _last;
}

Assistant:

Float operator[](int index) const noexcept
    {
        Float ret = linear_elements[index];

        auto first = indices[index];
        auto last = indices[index + 1];

        for (; first != last; ++first)
            ret += quadratic_elements[first].factor;

        return ret;
    }